

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O1

void __thiscall
cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph
          (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *this,
          Cluster<bitset_detail::IntBitSet<unsigned_int>_> *cluster)

{
  pointer pEVar1;
  pointer pEVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  pointer ppVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  IntBitSet<unsigned_int> *pIVar10;
  long in_FS_OFFSET;
  bool bVar11;
  allocator_type local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ::vector(&this->entries,
           ((long)(cluster->
                  super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(cluster->
                  super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,&local_21);
  ppVar6 = (cluster->
           super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((cluster->
      super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar6) {
    uVar5 = 1;
    uVar7 = 0;
    do {
      pEVar1 = (this->entries).
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar1[uVar7].feerate.size = ppVar6[uVar7].first.size;
      pEVar1[uVar7].feerate.fee = ppVar6[uVar7].first.fee;
      (this->entries).
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar7].ancestors.m_val =
           (cluster->
           super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[uVar7].second.m_val | 1 << (uVar5 - 1 & 0x1f);
      uVar7 = (ulong)uVar5;
      ppVar6 = (cluster->
               super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(cluster->
                     super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6 >> 3) *
              -0x5555555555555555;
      uVar5 = uVar5 + 1;
    } while (uVar7 <= uVar8 && uVar8 - uVar7 != 0);
  }
  pEVar1 = (this->entries).
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->entries).
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = ((long)pEVar2 - (long)pEVar1 >> 3) * -0x5555555555555555;
  if (pEVar2 != pEVar1) {
    uVar8 = 0;
    do {
      uVar5 = pEVar1[uVar8].ancestors.m_val;
      uVar9 = 1;
      pIVar10 = &pEVar1->ancestors;
      do {
        if ((pIVar10->m_val & 1 << ((byte)uVar8 & 0x1f)) != 0) {
          pIVar10->m_val = pIVar10->m_val | uVar5;
        }
        pIVar10 = pIVar10 + 6;
        bVar11 = uVar9 <= uVar7;
        lVar4 = uVar7 - uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar11 && lVar4 != 0);
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar8 <= uVar7 && uVar7 - uVar8 != 0);
  }
  if (pEVar2 != pEVar1) {
    uVar8 = 0;
    do {
      uVar5 = pEVar1[uVar8].ancestors.m_val;
      if (uVar5 != 0) {
        uVar3 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        do {
          pEVar1[uVar3].descendants.m_val =
               pEVar1[uVar3].descendants.m_val | 1 << ((byte)uVar8 & 0x1f);
          uVar5 = uVar5 - 1 & uVar5;
          uVar3 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
        } while (uVar5 != 0);
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar8 <= uVar7 && uVar7 - uVar8 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit DepGraph(const Cluster<SetType>& cluster) noexcept : entries(cluster.size())
    {
        for (ClusterIndex i = 0; i < cluster.size(); ++i) {
            // Fill in fee and size.
            entries[i].feerate = cluster[i].first;
            // Fill in direct parents as ancestors.
            entries[i].ancestors = cluster[i].second;
            // Make sure transactions are ancestors of themselves.
            entries[i].ancestors.Set(i);
        }

        // Propagate ancestor information.
        for (ClusterIndex i = 0; i < entries.size(); ++i) {
            // At this point, entries[a].ancestors[b] is true iff b is an ancestor of a and there
            // is a path from a to b through the subgraph consisting of {a, b} union
            // {0, 1, ..., (i-1)}.
            SetType to_merge = entries[i].ancestors;
            for (ClusterIndex j = 0; j < entries.size(); ++j) {
                if (entries[j].ancestors[i]) {
                    entries[j].ancestors |= to_merge;
                }
            }
        }

        // Fill in descendant information by transposing the ancestor information.
        for (ClusterIndex i = 0; i < entries.size(); ++i) {
            for (auto j : entries[i].ancestors) {
                entries[j].descendants.Set(i);
            }
        }
    }